

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homology.h
# Opt level: O2

void print_homology_usage(bool no_filtration)

{
  pointer pbVar1;
  ostream *poVar2;
  undefined7 in_register_00000039;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> f;
  string asStack_48 [32];
  
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "  --cache folder     cache the coboundary matrix in the given folder");
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((int)CONCAT71(in_register_00000039,no_filtration) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "  --filtration       use the specified algorithm to compute the filtration. Options are:"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    pbVar1 = custom_filtration_computer_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = custom_filtration_computer_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      std::__cxx11::string::string(asStack_48,(string *)pbVar3);
      poVar2 = std::operator<<((ostream *)&std::cerr,"                         ");
      poVar2 = std::operator<<(poVar2,asStack_48);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(asStack_48);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "  --max-dim          the maximal homology dimension to be computed");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "  --min-dim          the minimal homology dimension to be computed");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "  --approximate n    skip all columns creating columns in the reduction matrix with"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "                     n non-trivial entries. Use this for hard problems, a good value"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "                     is often 100000. Increase for higher precision, decrease for faster computation."
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "  --threads          number of threads to use for the computation (default: number of threads that your machine can execute simultaneously)"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void print_homology_usage(bool no_filtration = false) {
	std::cerr << "  --cache folder     cache the coboundary matrix in the given folder" << std::endl;
	if (!no_filtration) {
		std::cerr << "  --filtration       use the specified algorithm to compute the filtration. Options are:"
		          << std::endl;

		for (auto f : custom_filtration_computer) std::cerr << "                         " << f << std::endl;
	}

	std::cerr << "  --max-dim          the maximal homology dimension to be computed" << std::endl
	          << "  --min-dim          the minimal homology dimension to be computed" << std::endl
#ifdef USE_COEFFICIENTS
	          << "  --modulus          compute homology with coefficients in the prime field Z/<p>Z" << std::endl
#endif
	          << "  --approximate n    skip all columns creating columns in the reduction matrix with" << std::endl
	          << "                     n non-trivial entries. Use this for hard problems, a good value" << std::endl
	          << "                     is often 100000. Increase for higher precision, decrease for faster computation." << std::endl
	          << "  --threads          number of threads to use for the computation (default: number of threads that your machine can execute simultaneously)" << std::endl
	          << std::endl;
}